

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::ChSystem(ChSystem *this)

{
  ChMaterialCompositionStrategy *pCVar1;
  undefined1 auVar2 [32];
  __shared_ptr<chrono::ChTimestepperEulerImplicitLinearized,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  ChSystem *local_28;
  
  (this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable =
       (_func_int **)&PTR_GetNcoords_y_01157b68;
  ChAssembly::ChAssembly(&this->assembly);
  (this->G_acc).m_data[0] = 0.0;
  (this->contact_container).
  super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->contact_container).
  super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->G_acc).m_data[1] = -9.8;
  (this->G_acc).m_data[2] = 0.0;
  this->is_initialized = false;
  this->is_updated = false;
  auVar2 = ZEXT832(0) << 0x20;
  this->ncoords = auVar2._0_4_;
  this->ndoc = auVar2._4_4_;
  this->nsysvars = auVar2._8_4_;
  this->ncoords_w = auVar2._12_4_;
  this->ndoc_w = auVar2._16_4_;
  this->nsysvars_w = auVar2._20_4_;
  this->ndof = auVar2._24_4_;
  this->ndoc_w_C = auVar2._28_4_;
  this->ncoords_w = auVar2._0_4_;
  this->ndoc_w = auVar2._4_4_;
  this->nsysvars_w = auVar2._8_4_;
  this->ndof = auVar2._12_4_;
  this->ndoc_w_C = auVar2._16_4_;
  this->ndoc_w_D = auVar2._20_4_;
  this->ch_time = (double)auVar2._24_8_;
  this->step = 0.04;
  this->step_min = 0.002;
  this->step_max = 0.04;
  this->tol_force = (double)&DAT_bff0000000000000;
  this->maxiter = 6;
  this->use_sleeping = false;
  auVar2 = ZEXT832(0) << 0x20;
  this->descriptor = (shared_ptr<chrono::ChSystemDescriptor>)auVar2._0_16_;
  this->solver = (shared_ptr<chrono::ChSolver>)auVar2._16_16_;
  this->min_bounce_speed = 0.15;
  this->max_penetration_recovery_speed = 0.6;
  this->stepcount = 0;
  this->setupcount = 0;
  this->solvecount = 0;
  this->write_matrix = false;
  (this->output_dir)._M_dataplus._M_p = (pointer)&(this->output_dir).field_2;
  (this->output_dir)._M_string_length = 0;
  (this->output_dir).field_2._M_local_buf[0] = '\0';
  this->ncontacts = 0;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collision_system = (shared_ptr<chrono::collision::ChCollisionSystem>)auVar2._0_16_;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._16_8_;
  (this->collision_callbacks).
  super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar2._24_8_;
  pCVar1 = (ChMaterialCompositionStrategy *)::operator_new(8);
  pCVar1->_vptr_ChMaterialCompositionStrategy =
       (_func_int **)&PTR__ChMaterialCompositionStrategy_01157e50;
  (this->composition_strategy)._M_t.
  super___uniq_ptr_impl<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_chrono::ChMaterialCompositionStrategy_*,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
  .super__Head_base<0UL,_chrono::ChMaterialCompositionStrategy_*,_false>._M_head_impl = pCVar1;
  this->visual_system = (ChVisualSystem *)0x0;
  this->nthreads_chrono = 1;
  this->nthreads_eigen = 1;
  this->nthreads_collision = 1;
  (this->timer_step).m_start.__d.__r = 0;
  (this->timer_step).m_end.__d.__r = 0;
  (this->timer_advance).m_start.__d.__r = 0;
  (this->timer_advance).m_end.__d.__r = 0;
  (this->timer_ls_solve).m_start.__d.__r = 0;
  (this->timer_ls_solve).m_end.__d.__r = 0;
  (this->timer_ls_setup).m_start.__d.__r = 0;
  (this->timer_ls_setup).m_end.__d.__r = 0;
  (this->timer_jacobian).m_start.__d.__r = 0;
  (this->timer_jacobian).m_end.__d.__r = 0;
  (this->timer_collision).m_start.__d.__r = 0;
  (this->timer_collision).m_end.__d.__r = 0;
  (this->timer_setup).m_start.__d.__r = 0;
  (this->timer_setup).m_end.__d.__r = 0;
  (this->timer_update).m_start.__d.__r = 0;
  (this->timer_update).m_end.__d.__r = 0;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->last_err = false;
  (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  this->applied_forces_current = false;
  (this->assembly).super_ChPhysicsItem.system = this;
  this->collision_system_type = BULLET;
  collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.03);
  collision::ChCollisionModel::SetDefaultSuggestedMargin(0.01);
  local_28 = this;
  std::make_shared<chrono::ChTimestepperEulerImplicitLinearized,chrono::ChSystem*>
            ((ChSystem **)&_Stack_38);
  std::__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChTimestepper,(__gnu_cxx::_Lock_policy)2> *)&this->timestepper,
             &_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

ChSystem::ChSystem()
    : G_acc(ChVector<>(0, -9.8, 0)),
      is_initialized(false),
      is_updated(false),
      ncoords(0),
      ndoc(0),
      nsysvars(0),
      ncoords_w(0),
      ndoc_w(0),
      nsysvars_w(0),
      ndof(0),
      ndoc_w_C(0),
      ndoc_w_D(0),
      ch_time(0),
      step(0.04),
      step_min(0.002),
      step_max(0.04),
      tol_force(-1),
      maxiter(6),
      use_sleeping(false),
      min_bounce_speed(0.15),
      max_penetration_recovery_speed(0.6),
      stepcount(0),
      setupcount(0),
      solvecount(0),
      write_matrix(false),
      ncontacts(0),
      composition_strategy(new ChMaterialCompositionStrategy),
      visual_system(nullptr),
      nthreads_chrono(ChOMP::GetNumProcs()),
      nthreads_eigen(1),
      nthreads_collision(1),
      last_err(false),
      applied_forces_current(false) {
    assembly.system = this;

    // Set default collision engine type, collision envelope, and margin.
    collision_system_type = collision::ChCollisionSystemType::BULLET;
    collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.03);
    collision::ChCollisionModel::SetDefaultSuggestedMargin(0.01);

    // Set default timestepper.
    timestepper = chrono_types::make_shared<ChTimestepperEulerImplicitLinearized>(this);
}